

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::AdjustRegion
          (BamStandardIndex *this,BamRegion *region,uint32_t *begin,uint32_t *end)

{
  int iVar1;
  bool bVar2;
  const_reference pvVar3;
  undefined8 uVar4;
  int32_t *in_RCX;
  int *in_RDX;
  BamRegion *in_RSI;
  long in_RDI;
  RefVector *references;
  size_type in_stack_ffffffffffffff58;
  vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *in_stack_ffffffffffffff60;
  allocator *paVar5;
  allocator local_81;
  string local_80 [16];
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  BamException *in_stack_ffffffffffffffa0;
  allocator local_49;
  string local_48 [32];
  RefVector *local_28;
  int32_t *local_20;
  int *local_18;
  BamRegion *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = BamReaderPrivate::GetReferenceData(*(BamReaderPrivate **)(in_RDI + 8));
  iVar1 = local_10->LeftPosition;
  pvVar3 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (iVar1 < pvVar3->RefLength) {
    *local_18 = local_10->LeftPosition;
    bVar2 = BamRegion::isRightBoundSpecified(local_10);
    if ((bVar2) && (local_10->LeftRefID == local_10->RightRefID)) {
      *local_20 = local_10->RightPosition;
    }
    else {
      pvVar3 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                         (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      *local_20 = pvVar3->RefLength;
    }
    return;
  }
  uVar4 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"BamStandardIndex::AdjustRegion",&local_49);
  paVar5 = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"invalid region requested",paVar5);
  BamException::BamException
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::AdjustRegion(const BamRegion& region, uint32_t& begin, uint32_t& end)
{

    // retrieve references from reader
    const RefVector& references = m_reader->GetReferenceData();

    // LeftPosition cannot be greater than or equal to reference length
    if (region.LeftPosition >= references.at(region.LeftRefID).RefLength)
        throw BamException("BamStandardIndex::AdjustRegion", "invalid region requested");

    // set region 'begin'
    begin = (unsigned int)region.LeftPosition;

    // if right bound specified AND left&right bounds are on same reference
    // OK to use right bound position as region 'end'
    if (region.isRightBoundSpecified() && (region.LeftRefID == region.RightRefID))
        end = (unsigned int)region.RightPosition;

    // otherwise, set region 'end' to last reference base
    else
        end = (unsigned int)references.at(region.LeftRefID).RefLength;
}